

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O1

void __thiscall TcpServerImpl::~TcpServerImpl(TcpServerImpl *this)

{
  function<void_(const_std::vector<TcpSocket_*,_std::allocator<TcpSocket_*>_>_&)> *pfVar1;
  _Manager_type *pp_Var2;
  _Manager_type p_Var3;
  pointer piVar4;
  
  (this->super_BaseSocketImpl)._vptr_BaseSocketImpl = (_func_int **)&PTR__TcpServerImpl_001474b8;
  pfVar1 = &this->m_fNewConnection;
  pp_Var2 = &(this->m_fNewConnection).super__Function_base._M_manager;
  p_Var3 = (this->m_fNewConnection).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
    *pp_Var2 = (_Manager_type)0x0;
    (this->m_fNewConnection)._M_invoker = (_Invoker_type)0x0;
  }
  (this->super_BaseSocketImpl).m_bStop = true;
  if ((this->super_BaseSocketImpl).m_thListen._M_id._M_thread != 0) {
    std::thread::join();
  }
  Delete(this);
  p_Var3 = (this->m_fNewConnectionParam).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->m_fNewConnectionParam,(_Any_data *)&this->m_fNewConnectionParam,
              __destroy_functor);
  }
  p_Var3 = *pp_Var2;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  piVar4 = (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar4 != (pointer)0x0) {
    operator_delete(piVar4,(long)(this->m_vSock).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar4);
  }
  piVar4 = (this->m_vSockAccept).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar4 != (pointer)0x0) {
    operator_delete(piVar4,(long)(this->m_vSockAccept).super__Vector_base<int,_std::allocator<int>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar4);
  }
  BaseSocketImpl::~BaseSocketImpl(&this->super_BaseSocketImpl);
  return;
}

Assistant:

TcpServerImpl::~TcpServerImpl()
{
    m_fNewConnection = nullptr;
    m_bStop = true; // Stops the listening thread

    if (m_thListen.joinable() == true)
        m_thListen.join();
    Delete();
}